

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  FieldDescriptor *arg;
  Mutex *this_00;
  long lVar1;
  GoogleOnceDynamic *pGVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  anon_union_8_8_13f84498_for_Symbol_2 aVar7;
  long lVar8;
  long lVar9;
  Symbol SVar10;
  FieldDescriptor *local_38;
  long lVar6;
  
  this_00 = this->builder_->pool_->mutex_;
  if (this_00 != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this_00);
  }
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
  lVar6 = CONCAT44(extraout_var,iVar5);
  SVar10 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar6 + 8),LOOKUP_ALL,true);
  aVar7 = SVar10.field_1;
  if (SVar10.type == MESSAGE) {
    if (*(char *)(*(long *)(lVar6 + 0x20) + 0x68) == '\x01') {
      bVar3 = 0 < *(int *)(aVar7.descriptor + 0x78);
      if (0 < *(int *)(aVar7.descriptor + 0x78)) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          lVar1 = *(long *)(aVar7.descriptor + 0x80);
          if (*(long *)(lVar1 + 0x58 + lVar8) == lVar6) {
            arg = (FieldDescriptor *)(lVar1 + lVar8);
            pGVar2 = *(GoogleOnceDynamic **)(lVar1 + 0x40 + lVar8);
            if (pGVar2 != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (pGVar2,FieldDescriptor::TypeOnceInit,arg);
            }
            if ((*(int *)(lVar1 + 0x48 + lVar8) != 0xb) || (*(int *)(lVar1 + 0x4c + lVar8) != 1))
            goto LAB_002f3017;
            pGVar2 = *(GoogleOnceDynamic **)(lVar1 + 0x40 + lVar8);
            if (pGVar2 != (GoogleOnceDynamic *)0x0) {
              GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                        (pGVar2,FieldDescriptor::TypeOnceInit,arg);
            }
            if (*(FieldDescriptor **)(lVar1 + 0x70 + lVar8) != (FieldDescriptor *)aVar7.descriptor)
            goto LAB_002f3017;
            bVar4 = false;
            local_38 = arg;
          }
          else {
LAB_002f3017:
            bVar4 = true;
          }
          if (!bVar4) break;
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0xa8;
          bVar3 = lVar9 < *(int *)(aVar7.descriptor + 0x78);
        } while (lVar9 < *(int *)(aVar7.descriptor + 0x78));
      }
      if (bVar3) {
        return local_38;
      }
    }
  }
  else if ((SVar10.type == FIELD) &&
          (*(FieldDescriptor *)(aVar7.descriptor + 0x50) != (FieldDescriptor)0x0)) {
    return (FieldDescriptor *)aVar7.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

virtual const FieldDescriptor* FindExtension(
      Message* message, const string& name) const {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result = builder_->LookupSymbolNoPlaceholder(
        name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return NULL;
  }